

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_add(REF_CELL ref_cell,REF_INT *nodes,REF_INT *new_cell)

{
  int iVar1;
  uint uVar2;
  REF_INT *pRVar3;
  int local_48;
  int local_44;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT max_limit;
  REF_INT chunk;
  REF_INT orig;
  REF_INT cell;
  REF_INT node;
  REF_INT *new_cell_local;
  REF_INT *nodes_local;
  REF_CELL ref_cell_local;
  
  *new_cell = -1;
  if (ref_cell->blank == -1) {
    if (ref_cell->max == 0x1fffffff) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2a8,
             "ref_cell_add","the number of cells is too large for integers, cannot grow");
      return 1;
    }
    iVar1 = ref_cell->max;
    if ((int)((double)iVar1 * 1.5) < 5000) {
      local_44 = 5000;
    }
    else {
      local_44 = (int)((double)iVar1 * 1.5);
    }
    if (0x1fffffff - iVar1 < 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2ae,
             "ref_cell_add","chunk limit at max");
      return 1;
    }
    if (local_44 < 0x1fffffff - iVar1) {
      local_48 = local_44;
    }
    else {
      local_48 = 0x1fffffff - iVar1;
    }
    ref_cell->max = iVar1 + local_48;
    fflush(_stdout);
    if (0 < ref_cell->size_per * ref_cell->max) {
      pRVar3 = (REF_INT *)realloc(ref_cell->c2n,(long)(ref_cell->size_per * ref_cell->max) << 2);
      ref_cell->c2n = pRVar3;
    }
    chunk = iVar1;
    if (ref_cell->c2n == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2b4,
             "ref_cell_add","realloc ref_cell->c2n NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
             (ulong)(uint)(ref_cell->size_per * ref_cell->max),
             (long)(ref_cell->size_per * ref_cell->max),4,
             (long)(ref_cell->size_per * ref_cell->max) << 2);
      return 2;
    }
    for (; chunk < ref_cell->max; chunk = chunk + 1) {
      ref_cell->c2n[ref_cell->size_per * chunk] = -1;
      ref_cell->c2n[ref_cell->size_per * chunk + 1] = chunk + 1;
    }
    ref_cell->c2n[ref_cell->size_per * (ref_cell->max + -1) + 1] = -1;
    ref_cell->blank = iVar1;
  }
  iVar1 = ref_cell->blank;
  ref_cell->blank = ref_cell->c2n[ref_cell->size_per * iVar1 + 1];
  for (orig = 0; orig < ref_cell->size_per; orig = orig + 1) {
    ref_cell->c2n[orig + ref_cell->size_per * iVar1] = nodes[orig];
  }
  orig = 0;
  while( true ) {
    if (ref_cell->node_per <= orig) {
      ref_cell->n = ref_cell->n + 1;
      *new_cell = iVar1;
      return 0;
    }
    uVar2 = ref_adj_add(ref_cell->ref_adj,nodes[orig],iVar1);
    if (uVar2 != 0) break;
    orig = orig + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x2c4,
         "ref_cell_add",(ulong)uVar2,"register cell");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_add(REF_CELL ref_cell, REF_INT *nodes,
                                REF_INT *new_cell) {
  REF_INT node, cell;
  REF_INT orig, chunk;
  REF_INT max_limit = REF_INT_MAX / 4;

  (*new_cell) = REF_EMPTY;

  if (REF_EMPTY == ref_cell_blank(ref_cell)) {
    RAS(ref_cell_max(ref_cell) != max_limit,
        "the number of cells is too large for integers, cannot grow");
    orig = ref_cell_max(ref_cell);
    /* geometric growth for efficiency */
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));

    /* try to keep under 32-bit limit */
    RAS(max_limit - orig > 0, "chunk limit at max");
    chunk = MIN(chunk, max_limit - orig);

    ref_cell_max(ref_cell) = orig + chunk;

    ref_realloc(ref_cell->c2n,
                ref_cell_size_per(ref_cell) * ref_cell_max(ref_cell), REF_INT);

    for (cell = orig; cell < ref_cell_max(ref_cell); cell++) {
      ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
      ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
    }
    ref_cell_c2n(ref_cell, 1, ref_cell_max(ref_cell) - 1) = REF_EMPTY;
    ref_cell_blank(ref_cell) = orig;
  }

  cell = ref_cell_blank(ref_cell);
  ref_cell_blank(ref_cell) = ref_cell_c2n(ref_cell, 1, cell);
  for (node = 0; node < ref_cell_size_per(ref_cell); node++)
    ref_cell_c2n(ref_cell, node, cell) = nodes[node];

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    RSS(ref_adj_add(ref_cell->ref_adj, nodes[node], cell), "register cell");

  ref_cell_n(ref_cell)++;

  (*new_cell) = cell;

  return REF_SUCCESS;
}